

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O3

uint32_t rest_rpc::MD5::MD5CE::CalcF(uint32_t i,IntermediateData *intermediate)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = intermediate->b;
  uVar1 = intermediate->c;
  uVar3 = intermediate->d;
  if (i < 0x10) {
    uVar2 = (uVar1 ^ uVar3) & uVar2;
LAB_0014baac:
    return uVar2 ^ uVar3;
  }
  if (i < 0x20) {
    uVar3 = (uVar2 ^ uVar1) & uVar3;
  }
  else {
    if (i < 0x30) {
      uVar2 = uVar1 ^ uVar2;
      goto LAB_0014baac;
    }
    uVar3 = uVar2 | ~uVar3;
  }
  return uVar1 ^ uVar3;
}

Assistant:

static uint32_t CalcF(const uint32_t i,
                        const IntermediateData &intermediate) {
    return CalcF(i, intermediate.b, intermediate.c, intermediate.d);
  }